

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<float> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  basic_appender<char> out_00;
  basic_appender<char> it;
  basic_appender<char> out_01;
  basic_appender<char> out_02;
  basic_appender<char> out_03;
  bool bVar1;
  char cVar2;
  presentation_type pVar3;
  make_unsigned_t<int> mVar4;
  int iVar5;
  int in_ECX;
  basic_specs *in_RDX;
  undefined4 *in_RSI;
  buffer<char> *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  bool pointy;
  int num_zeros;
  digit_grouping<char> grouping_1;
  int num_zeros_3;
  digit_grouping<char> grouping;
  int num_zeros_2;
  int exp;
  anon_class_28_8_ce6b8c4d write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_24_3_3ccdf9fd use_exp_format;
  int output_exp;
  char decimal_point;
  size_t size;
  char zero;
  int significand_size;
  significand_type significand;
  bool local_2a1;
  locale_ref in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  format_specs *in_stack_fffffffffffffd70;
  format_specs *specs_00;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  int iVar6;
  int in_stack_fffffffffffffd8c;
  digit_grouping<char> *in_stack_fffffffffffffd90;
  digit_grouping<char> *this;
  undefined1 local_261;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 uVar7;
  undefined1 uVar8;
  iterator in_stack_fffffffffffffda8;
  locale_ref in_stack_fffffffffffffdb0;
  int local_214;
  format_specs local_1c0 [4];
  int local_17c;
  int *local_178;
  undefined4 *local_170;
  int *local_168;
  undefined4 *local_160;
  digit_grouping<char> *local_158;
  basic_specs *local_150;
  char *local_148;
  int *local_140;
  undefined1 *local_138;
  buffer<char> *local_130;
  undefined8 local_118;
  digit_grouping<char> local_110;
  int local_d0;
  int local_cc;
  buffer<char> *local_c8;
  buffer<char> *local_c0;
  buffer<char> *local_b8;
  basic_appender<char> local_b0;
  buffer<char> *local_a8;
  int local_a0;
  undefined4 local_9c;
  int local_98;
  char local_94;
  int local_90;
  undefined1 local_8c;
  undefined1 local_8b;
  int local_88;
  undefined1 local_81;
  undefined4 local_80;
  int local_7c;
  int local_78;
  basic_specs local_74;
  basic_specs local_6c;
  int local_64;
  undefined4 local_60;
  int local_5c;
  undefined8 local_58;
  char local_49;
  ulong local_48;
  undefined1 local_39;
  int local_38;
  undefined4 local_34;
  undefined4 local_30;
  int local_2c;
  basic_specs *local_28;
  undefined4 *local_20;
  undefined8 local_18;
  buffer<char> *local_10;
  buffer<char> *local_8;
  
  local_34 = *in_RSI;
  local_30 = in_R8D;
  local_2c = in_ECX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_R9;
  local_10 = in_RDI;
  local_38 = get_significand_size<float>((decimal_fp<float> *)0x629034);
  local_39 = 0x30;
  mVar4 = to_unsigned<int>(0);
  local_48 = (ulong)(mVar4 + (local_2c != 0));
  bVar1 = basic_specs::localized(local_28);
  if (bVar1) {
    local_58 = local_18;
    cVar2 = decimal_point<char>(in_stack_fffffffffffffd60);
    uVar7 = CONCAT13(cVar2,(int3)in_stack_fffffffffffffda4);
  }
  else {
    uVar7 = CONCAT13(0x2e,(int3)in_stack_fffffffffffffda4);
  }
  local_49 = (char)((uint)uVar7 >> 0x18);
  local_64 = local_20[1] + local_38 + -1;
  local_74 = *local_28;
  local_6c = local_28[1];
  local_60 = local_30;
  local_5c = local_64;
  bVar1 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<float>,_fmt::v11::detail::digit_grouping<char>_>
          ::anon_class_24_3_3ccdf9fd::operator()
                    ((anon_class_24_3_3ccdf9fd *)
                     CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  if (bVar1) {
    local_78 = 0;
    bVar1 = basic_specs::alt(local_28);
    if (bVar1) {
      local_78 = *(int *)local_28[1].fill_data_ - local_38;
      if (local_78 < 0) {
        local_78 = 0;
      }
      mVar4 = to_unsigned<int>(0);
      local_48 = mVar4 + local_48;
    }
    else if (local_38 == 1) {
      local_49 = '\0';
    }
    iVar6 = local_5c;
    if (local_5c < 0) {
      iVar6 = -local_5c;
    }
    local_80 = 2;
    if ((99 < iVar6) && (local_80 = 3, 999 < iVar6)) {
      local_80 = 4;
    }
    local_7c = iVar6;
    mVar4 = to_unsigned<int>(0);
    local_48 = mVar4 + local_48;
    bVar1 = basic_specs::upper(local_28);
    local_261 = 0x45;
    if (!bVar1) {
      local_261 = 0x65;
    }
    local_81 = local_261;
    local_a0 = local_2c;
    local_9c = local_34;
    local_98 = local_38;
    local_94 = local_49;
    local_90 = local_78;
    local_8c = 0x30;
    local_8b = local_261;
    local_88 = local_5c;
    if ((int)local_28[1].data_ < 1) {
      local_b0.container = local_10;
      local_c8 = local_10;
      it.container._4_4_ = in_stack_fffffffffffffd7c;
      it.container._0_4_ = in_stack_fffffffffffffd78;
      local_c0 = (buffer<char> *)reserve<char>(it,(size_t)in_stack_fffffffffffffd70);
      local_b8 = (buffer<char> *)
                 do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<float>,_fmt::v11::detail::digit_grouping<char>_>
                 ::anon_class_28_8_ce6b8c4d::operator()
                           ((anon_class_28_8_ce6b8c4d *)CONCAT44(uVar7,iVar6),
                            in_stack_fffffffffffffda8);
      local_8 = (buffer<char> *)
                base_iterator<fmt::v11::basic_appender<char>>
                          (local_b0,(basic_appender<char>)local_b8);
    }
    else {
      local_a8 = local_10;
      out_00.container._4_4_ = in_stack_fffffffffffffd7c;
      out_00.container._0_4_ = in_stack_fffffffffffffd78;
      local_8 = (buffer<char> *)
                write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          (out_00,in_stack_fffffffffffffd70,
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                           (anon_class_28_8_ce6b8c4d *)in_stack_fffffffffffffd60.locale_);
    }
  }
  else {
    local_cc = local_20[1] + local_38;
    if ((int)local_20[1] < 0) {
      if (local_cc < 1) {
        local_214 = -local_cc;
        if (((local_38 == 0) && (-1 < *(int *)local_28[1].fill_data_)) &&
           (*(int *)local_28[1].fill_data_ < local_214)) {
          local_214 = *(int *)local_28[1].fill_data_;
        }
        local_2a1 = true;
        if ((local_214 == 0) && (local_2a1 = true, local_38 == 0)) {
          local_2a1 = basic_specs::alt(local_28);
        }
        mVar4 = to_unsigned<int>(0);
        local_48 = ((local_2a1 != false) + 1 + mVar4) + local_48;
        out_03.container._4_4_ = in_stack_fffffffffffffd7c;
        out_03.container._0_4_ = in_stack_fffffffffffffd78;
        local_8 = (buffer<char> *)
                  write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_>
                            (out_03,in_stack_fffffffffffffd70,
                             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                             (anon_class_56_7_88befd79 *)in_stack_fffffffffffffd60.locale_);
      }
      else {
        bVar1 = basic_specs::alt(local_28);
        uVar8 = (undefined1)((uint)uVar7 >> 0x18);
        if (bVar1) {
          iVar6 = *(int *)local_28[1].fill_data_ - local_38;
        }
        else {
          iVar6 = 0;
        }
        local_17c = iVar6;
        iVar5 = max_of<int>(iVar6,0);
        local_48 = local_48 + (iVar5 + 1);
        basic_specs::localized(local_28);
        specs_00 = local_1c0;
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)in_stack_fffffffffffffda8.container,
                   in_stack_fffffffffffffdb0,(bool)uVar8);
        iVar5 = digit_grouping<char>::count_separators
                          (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
        mVar4 = to_unsigned<int>(0);
        local_48 = local_48 + mVar4;
        out_02.container._4_4_ = iVar6;
        out_02.container._0_4_ = iVar5;
        local_8 = (buffer<char> *)
                  write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_>
                            (out_02,specs_00,CONCAT44(mVar4,in_stack_fffffffffffffd68),
                             (anon_class_64_8_085c650e *)in_stack_fffffffffffffd60.locale_);
        digit_grouping<char>::~digit_grouping((digit_grouping<char> *)local_8);
      }
    }
    else {
      mVar4 = to_unsigned<int>(0);
      uVar8 = (undefined1)((uint)uVar7 >> 0x18);
      local_48 = mVar4 + local_48;
      local_d0 = *(int *)local_28[1].fill_data_ - local_cc;
      abort_fuzzing_if(false);
      bVar1 = basic_specs::alt(local_28);
      if (bVar1) {
        local_48 = local_48 + 1;
        if ((local_d0 < 1) && (pVar3 = basic_specs::type(local_28), pVar3 != fixed)) {
          local_d0 = 0;
        }
        if (0 < local_d0) {
          mVar4 = to_unsigned<int>(0);
          local_48 = mVar4 + local_48;
        }
      }
      local_118 = local_18;
      basic_specs::localized(local_28);
      this = &local_110;
      digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                ((digit_grouping<char> *)in_stack_fffffffffffffda8.container,
                 in_stack_fffffffffffffdb0,(bool)uVar8);
      digit_grouping<char>::count_separators(this,in_stack_fffffffffffffd8c);
      mVar4 = to_unsigned<int>(0);
      local_48 = local_48 + mVar4;
      local_130 = local_10;
      local_178 = &local_2c;
      local_170 = &local_34;
      local_168 = &local_38;
      local_160 = local_20;
      local_158 = &local_110;
      local_150 = local_28;
      local_148 = &local_49;
      local_140 = &local_d0;
      local_138 = &local_39;
      out_01.container._4_4_ = in_stack_fffffffffffffd7c;
      out_01.container._0_4_ = in_stack_fffffffffffffd78;
      local_8 = (buffer<char> *)
                write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_>
                          (out_01,in_stack_fffffffffffffd70,
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                           (anon_class_72_9_eb40e20e *)in_stack_fffffffffffffd60.locale_);
      digit_grouping<char>::~digit_grouping
                ((digit_grouping<char> *)in_stack_fffffffffffffd60.locale_);
    }
  }
  return (basic_appender<char>)local_8;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}